

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int __thiscall ON_WindingNumber::WindingNumber(ON_WindingNumber *this)

{
  int iVar1;
  int iVar2;
  int local_14;
  int winding_number;
  ON_WindingNumber *this_local;
  
  local_14 = this->m_left_crossing_number;
  iVar1 = this->m_right_crossing_number;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = local_14;
  if (local_14 < 1) {
    iVar2 = -local_14;
  }
  if (iVar1 < iVar2) {
    local_14 = this->m_right_crossing_number;
  }
  iVar1 = this->m_above_crossing_number;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = local_14;
  if (local_14 < 1) {
    iVar2 = -local_14;
  }
  if (iVar1 < iVar2) {
    local_14 = this->m_above_crossing_number;
  }
  iVar1 = this->m_below_crossing_number;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = local_14;
  if (local_14 < 1) {
    iVar2 = -local_14;
  }
  if (iVar1 < iVar2) {
    local_14 = this->m_below_crossing_number;
  }
  return local_14;
}

Assistant:

int ON_WindingNumber::WindingNumber() const
{
  int winding_number = m_left_crossing_number;
  if (abs(m_right_crossing_number) < abs(winding_number))
    winding_number = m_right_crossing_number;
  if (abs(m_above_crossing_number) < abs(winding_number))
    winding_number = m_above_crossing_number;
  if (abs(m_below_crossing_number) < abs(winding_number))
    winding_number = m_below_crossing_number;
  return winding_number;
}